

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state_machine_options.hpp
# Opt level: O0

bool __thiscall
duckdb::CSVStateMachineOptions::operator==
          (CSVStateMachineOptions *this,CSVStateMachineOptions *other)

{
  bool bVar1;
  long in_RSI;
  CSVOption<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_RDI;
  CSVOption<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_ffffffffffffffd8;
  bool local_11;
  
  bVar1 = CSVOption<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator==(in_RDI,in_stack_ffffffffffffffd8);
  local_11 = false;
  if (bVar1) {
    bVar1 = CSVOption<char>::operator==
                      ((CSVOption<char> *)(in_RDI + 1),(CSVOption<char> *)(in_RSI + 0x28));
    local_11 = false;
    if (bVar1) {
      bVar1 = CSVOption<char>::operator==
                        ((CSVOption<char> *)&in_RDI[1].field_0x2,(CSVOption<char> *)(in_RSI + 0x2a))
      ;
      local_11 = false;
      if (bVar1) {
        bVar1 = CSVOption<duckdb::NewLineIdentifier>::operator==
                          ((CSVOption<duckdb::NewLineIdentifier> *)&in_RDI[1].field_0x6,
                           (CSVOption<duckdb::NewLineIdentifier> *)(in_RSI + 0x2e));
        local_11 = false;
        if (bVar1) {
          bVar1 = CSVOption<char>::operator==
                            ((CSVOption<char> *)&in_RDI[1].field_0x4,
                             (CSVOption<char> *)(in_RSI + 0x2c));
          local_11 = false;
          if (bVar1) {
            local_11 = CSVOption<bool>::operator==
                                 ((CSVOption<bool> *)&in_RDI[1].value,
                                  (CSVOption<bool> *)(in_RSI + 0x30));
          }
        }
      }
    }
  }
  return local_11;
}

Assistant:

bool operator==(const CSVStateMachineOptions &other) const {
		return delimiter == other.delimiter && quote == other.quote && escape == other.escape &&
		       new_line == other.new_line && comment == other.comment && strict_mode == other.strict_mode;
	}